

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpReader.cpp
# Opt level: O2

void __thiscall OpenMD::DumpReader::readSiteData(DumpReader *this,istream *inputStream)

{
  long *plVar1;
  long lVar2;
  string line;
  allocator<char> local_49;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,this->buffer,&local_49);
  while( true ) {
    plVar1 = (long *)std::istream::getline((char *)inputStream,(long)this->buffer);
    if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) break;
    std::__cxx11::string::assign((char *)&local_48);
    lVar2 = std::__cxx11::string::find((char *)&local_48,0x2474ce);
    if (lVar2 != -1) break;
    parseSiteLine(this,&local_48);
  }
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void DumpReader::readSiteData(std::istream& inputStream) {
    std::string line(buffer);

    // We already found the starting <SiteData> tag or we wouldn't be
    // here, so just start parsing until we get to the ending
    // </SiteData> tag:

    while (inputStream.getline(buffer, bufferSize)) {
      line = buffer;

      if (line.find("</SiteData>") != std::string::npos) { break; }

      parseSiteLine(line);
    }
  }